

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::reactive_socket_service
          (reactive_socket_service<asio::ip::tcp> *this,io_context *io_context)

{
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.key_.type_info_ = (type_info *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.key_.id_ = (id *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.owner_ = &io_context->super_execution_context;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.next_ = (service *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service._vptr_service = (_func_int **)&PTR__noncopyable_00170c88;
  reactive_socket_service_base::reactive_socket_service_base
            (&this->super_reactive_socket_service_base,io_context);
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service._vptr_service = (_func_int **)&PTR__noncopyable_00170bd0;
  return;
}

Assistant:

reactive_socket_service(asio::io_context& io_context)
    : service_base<reactive_socket_service<Protocol> >(io_context),
      reactive_socket_service_base(io_context)
  {
  }